

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_error_manager.hpp
# Opt level: O2

void __thiscall duckdb::TaskErrorManager::Reset(TaskErrorManager *this)

{
  ::std::mutex::lock(&this->error_lock);
  ::std::vector<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>::clear
            (&(this->exceptions).super_vector<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>
            );
  LOCK();
  (this->has_error)._M_base._M_i = false;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void Reset() {
		lock_guard<mutex> elock(error_lock);
		exceptions.clear();
		has_error = false;
	}